

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokPubkeyCalc(octet *pubkey,octet *privkey,size_t privkey_len)

{
  long in_RDX;
  bign_params params [1];
  err_t code;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  bign_params *in_stack_fffffffffffffe88;
  octet *in_stack_fffffffffffffea8;
  bign_params *in_stack_fffffffffffffeb0;
  octet *in_stack_fffffffffffffeb8;
  bign_params *in_stack_fffffffffffffec0;
  octet *in_stack_fffffffffffffec8;
  undefined4 local_4;
  
  local_4 = btokParamsStd(in_stack_fffffffffffffe88,
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  if (local_4 == 0) {
    if (in_RDX == 0x18) {
      local_4 = bign96PubkeyCalc(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                 in_stack_fffffffffffffea8);
    }
    else {
      local_4 = bignPubkeyCalc(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffeb8);
    }
  }
  return local_4;
}

Assistant:

static err_t btokPubkeyCalc(octet pubkey[], const octet privkey[],
	size_t privkey_len)
{
	err_t code;
	bign_params params[1];
	// загрузить параметры
	code = btokParamsStd(params, privkey_len);
	ERR_CALL_CHECK(code);
	// вычислить ключ
	return privkey_len == 24 ? bign96PubkeyCalc(pubkey, params, privkey) :
		bignPubkeyCalc(pubkey, params, privkey);
}